

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlParserInputBufferCreateStatic(char *mem,int size,xmlCharEncoding enc)

{
  xmlBufPtr pxVar1;
  xmlCharEncodingHandlerPtr pxVar2;
  int *piVar3;
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  int size_local;
  char *mem_local;
  
  if (size < 0) {
    mem_local = (char *)0x0;
  }
  else if (mem == (char *)0x0) {
    mem_local = (char *)0x0;
  }
  else {
    mem_local = (char *)(*xmlMalloc)(0x40);
    if (mem_local == (char *)0x0) {
      xmlIOErrMemory("creating input buffer");
      mem_local = (char *)0x0;
    }
    else {
      memset(mem_local,0,0x40);
      pxVar1 = xmlBufCreateStatic(mem,(long)size);
      *(xmlBufPtr *)(mem_local + 0x20) = pxVar1;
      if (*(long *)(mem_local + 0x20) == 0) {
        (*xmlFree)(mem_local);
        mem_local = (char *)0x0;
      }
      else {
        pxVar2 = xmlGetCharEncodingHandler(enc);
        *(xmlCharEncodingHandlerPtr *)(mem_local + 0x18) = pxVar2;
        if (*(long *)(mem_local + 0x18) == 0) {
          mem_local[0x28] = '\0';
          mem_local[0x29] = '\0';
          mem_local[0x2a] = '\0';
          mem_local[0x2b] = '\0';
          mem_local[0x2c] = '\0';
          mem_local[0x2d] = '\0';
          mem_local[0x2e] = '\0';
          mem_local[0x2f] = '\0';
        }
        else {
          piVar3 = __xmlDefaultBufferSize();
          pxVar1 = xmlBufCreateSize((long)(*piVar3 << 1));
          *(xmlBufPtr *)(mem_local + 0x28) = pxVar1;
        }
        mem_local[0x30] = -1;
        mem_local[0x31] = -1;
        mem_local[0x32] = -1;
        mem_local[0x33] = -1;
        *(char **)mem_local = mem;
        mem_local[8] = '\0';
        mem_local[9] = '\0';
        mem_local[10] = '\0';
        mem_local[0xb] = '\0';
        mem_local[0xc] = '\0';
        mem_local[0xd] = '\0';
        mem_local[0xe] = '\0';
        mem_local[0xf] = '\0';
        mem_local[0x10] = '\0';
        mem_local[0x11] = '\0';
        mem_local[0x12] = '\0';
        mem_local[0x13] = '\0';
        mem_local[0x14] = '\0';
        mem_local[0x15] = '\0';
        mem_local[0x16] = '\0';
        mem_local[0x17] = '\0';
      }
    }
  }
  return (xmlParserInputBufferPtr)mem_local;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateStatic(const char *mem, int size,
                                 xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (size < 0) return(NULL);
    if (mem == NULL) return(NULL);

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating input buffer");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreateStatic((void *)mem, size);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    ret->encoder = xmlGetCharEncodingHandler(enc);
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    else
        ret->raw = NULL;
    ret->compressed = -1;
    ret->context = (void *) mem;
    ret->readcallback = NULL;
    ret->closecallback = NULL;

    return(ret);
}